

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::EmbedParameter::MergePartialFromCodedStream(EmbedParameter *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  void *pvVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  FillerParameter *pFVar7;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  byte *pbVar8;
  long lVar9;
  int iVar10;
  UnknownFieldSet *unknown_fields;
  char cVar11;
  uint tag;
  ulong uVar12;
  pair<unsigned_long,_bool> pVar13;
  int local_50;
  int local_4c;
  
  do {
    pbVar8 = input->buffer_;
    uVar6 = 0;
    if (pbVar8 < input->buffer_end_) {
      bVar1 = *pbVar8;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_004210aa;
      input->buffer_ = pbVar8 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_004210aa:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar12 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar6 | uVar12;
    }
    tag = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto switchD_0042112e_default;
    cVar11 = (char)uVar12;
    switch((uint)(uVar12 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar11 != '\b') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      pbVar8 = input->buffer_;
      if (pbVar8 < input->buffer_end_) {
        bVar1 = *pbVar8;
        uVar6 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->num_output_ = (uint)bVar1;
LAB_0042126d:
          input->buffer_ = pbVar8 + 1;
          goto LAB_0042110b;
        }
      }
      else {
        uVar6 = 0;
      }
      lVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
      this->num_output_ = (uint32)lVar9;
LAB_004212c9:
      if (-1 < lVar9) goto LAB_0042110b;
      goto LAB_004212d2;
    case 2:
      if (cVar11 == '\x10') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        pbVar8 = input->buffer_;
        if (pbVar8 < input->buffer_end_) {
          bVar1 = *pbVar8;
          uVar6 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->input_dim_ = (uint)bVar1;
            goto LAB_0042126d;
          }
        }
        else {
          uVar6 = 0;
        }
        lVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        this->input_dim_ = (uint32)lVar9;
        goto LAB_004212c9;
      }
      break;
    case 3:
      if (cVar11 != '\x18') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar4 + 1;
        pVar13._8_8_ = 1;
        pVar13.first = (long)(char)uVar2;
      }
      else {
        pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      iVar10 = 6;
      if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_0042110d;
      this->bias_term_ = pVar13.first != 0;
      goto LAB_0042110b;
    case 4:
      if (cVar11 != '\"') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if (this->weight_filler_ == (FillerParameter *)0x0) {
        pFVar7 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar7);
        this->weight_filler_ = pFVar7;
      }
      MergePartialFromCodedStream();
      iVar10 = local_4c;
      uVar12 = extraout_RAX_00;
joined_r0x004211a9:
      if ((uVar12 & 1) == 0) goto LAB_0042110b;
      goto LAB_0042110d;
    case 5:
      if (cVar11 == '*') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        if (this->bias_filler_ == (FillerParameter *)0x0) {
          pFVar7 = (FillerParameter *)operator_new(0x40);
          FillerParameter::FillerParameter(pFVar7);
          this->bias_filler_ = pFVar7;
        }
        MergePartialFromCodedStream();
        iVar10 = local_50;
        uVar12 = extraout_RAX;
        goto joined_r0x004211a9;
      }
    }
switchD_0042112e_default:
    iVar10 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar3 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        unknown_fields =
             google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      bVar5 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
      if (bVar5) {
LAB_0042110b:
        iVar10 = 0;
      }
      else {
LAB_004212d2:
        iVar10 = 6;
      }
    }
LAB_0042110d:
    if (iVar10 != 0) {
      return iVar10 != 6;
    }
  } while( true );
}

Assistant:

bool EmbedParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.EmbedParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional uint32 num_output = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_num_output();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &num_output_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 input_dim = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_input_dim();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &input_dim_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool bias_term = 3 [default = true];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_bias_term();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &bias_term_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter weight_filler = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weight_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter bias_filler = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.EmbedParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.EmbedParameter)
  return false;
#undef DO_
}